

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

void jsgf_grammar_free(jsgf_t *jsgf)

{
  glist_t local_20;
  gnode_t *gn;
  hash_iter_t *itor;
  jsgf_t *jsgf_local;
  
  if (jsgf->parent == (jsgf_t *)0x0) {
    for (gn = (gnode_t *)hash_table_iter(jsgf->rules); gn != (gnode_t *)0x0;
        gn = (gnode_t *)hash_table_iter_next((hash_iter_t *)gn)) {
      ckd_free((gn->next->data).ptr);
      jsgf_rule_free((jsgf_rule_t *)gn->next[1].data.ptr);
    }
    hash_table_free(jsgf->rules);
    for (gn = (gnode_t *)hash_table_iter(jsgf->imports); gn != (gnode_t *)0x0;
        gn = (gnode_t *)hash_table_iter_next((hash_iter_t *)gn)) {
      ckd_free((gn->next->data).ptr);
      jsgf_grammar_free((jsgf_t *)gn->next[1].data.ptr);
    }
    hash_table_free(jsgf->imports);
    for (local_20 = jsgf->searchpath; local_20 != (glist_t)0x0; local_20 = local_20->next) {
      ckd_free((local_20->data).ptr);
    }
    glist_free(jsgf->searchpath);
    for (local_20 = jsgf->links; local_20 != (glist_t)0x0; local_20 = local_20->next) {
      ckd_free((local_20->data).ptr);
    }
    glist_free(jsgf->links);
  }
  ckd_free(jsgf->name);
  ckd_free(jsgf->version);
  ckd_free(jsgf->charset);
  ckd_free(jsgf->locale);
  ckd_free(jsgf);
  return;
}

Assistant:

void
jsgf_grammar_free(jsgf_t * jsgf)
{
    /* FIXME: Probably should just use refcounting instead. */
    if (jsgf->parent == NULL) {
        hash_iter_t *itor;
        gnode_t *gn;

        for (itor = hash_table_iter(jsgf->rules); itor;
             itor = hash_table_iter_next(itor)) {
            ckd_free((char *) itor->ent->key);
            jsgf_rule_free((jsgf_rule_t *) itor->ent->val);
        }
        hash_table_free(jsgf->rules);
        for (itor = hash_table_iter(jsgf->imports); itor;
             itor = hash_table_iter_next(itor)) {
            ckd_free((char *) itor->ent->key);
            jsgf_grammar_free((jsgf_t *) itor->ent->val);
        }
        hash_table_free(jsgf->imports);
        for (gn = jsgf->searchpath; gn; gn = gnode_next(gn))
            ckd_free(gnode_ptr(gn));
        glist_free(jsgf->searchpath);
        for (gn = jsgf->links; gn; gn = gnode_next(gn))
            ckd_free(gnode_ptr(gn));
        glist_free(jsgf->links);
    }
    ckd_free(jsgf->name);
    ckd_free(jsgf->version);
    ckd_free(jsgf->charset);
    ckd_free(jsgf->locale);
    ckd_free(jsgf);
}